

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterYs<unsigned_char>,_ImPlot::TransformerLinLog>::operator()
          (LineStripRenderer<ImPlot::GetterYs<unsigned_char>,_ImPlot::TransformerLinLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ImVec2 IVar5;
  int iVar6;
  ImU32 IVar7;
  uint uVar8;
  GetterYs<unsigned_char> *pGVar9;
  TransformerLinLog *pTVar10;
  ImPlotPlot *pIVar11;
  ImDrawVert *pIVar12;
  ImDrawIdx *pIVar13;
  ImPlotContext *pIVar14;
  ImDrawIdx IVar15;
  bool bVar16;
  float fVar17;
  double dVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  pIVar14 = GImPlot;
  pGVar9 = this->Getter;
  dVar2 = pGVar9->XScale;
  dVar3 = pGVar9->X0;
  pTVar10 = this->Transformer;
  iVar6 = pGVar9->Count;
  dVar18 = log10((double)pGVar9->Ys
                         [(long)(((prim + 1 + pGVar9->Offset) % iVar6 + iVar6) % iVar6) *
                          (long)pGVar9->Stride] /
                 GImPlot->CurrentPlot->YAxis[pTVar10->YAxis].Range.Min);
  iVar6 = pTVar10->YAxis;
  pIVar11 = pIVar14->CurrentPlot;
  dVar4 = pIVar11->YAxis[iVar6].Range.Min;
  fVar21 = (float)((((double)(prim + 1) * dVar2 + dVar3) - (pIVar11->XAxis).Range.Min) * pIVar14->Mx
                  + (double)pIVar14->PixelRange[iVar6].Min.x);
  fVar22 = (float)((((double)(float)(dVar18 / pIVar14->LogDenY[iVar6]) *
                     (pIVar11->YAxis[iVar6].Range.Max - dVar4) + dVar4) - dVar4) *
                   pIVar14->My[iVar6] + (double)pIVar14->PixelRange[iVar6].Min.y);
  fVar20 = (this->P1).x;
  fVar23 = (this->P1).y;
  fVar19 = fVar23;
  if (fVar22 <= fVar23) {
    fVar19 = fVar22;
  }
  bVar16 = false;
  if ((fVar19 < (cull_rect->Max).y) &&
     (fVar19 = (float)(-(uint)(fVar22 <= fVar23) & (uint)fVar23 |
                      ~-(uint)(fVar22 <= fVar23) & (uint)fVar22), pfVar1 = &(cull_rect->Min).y,
     bVar16 = false, *pfVar1 <= fVar19 && fVar19 != *pfVar1)) {
    fVar19 = fVar20;
    if (fVar21 <= fVar20) {
      fVar19 = fVar21;
    }
    if (fVar19 < (cull_rect->Max).x) {
      fVar19 = (float)(~-(uint)(fVar21 <= fVar20) & (uint)fVar21 |
                      -(uint)(fVar21 <= fVar20) & (uint)fVar20);
      bVar16 = (cull_rect->Min).x <= fVar19 && fVar19 != (cull_rect->Min).x;
    }
  }
  if (bVar16 != false) {
    fVar19 = this->Weight;
    IVar7 = this->Col;
    IVar5 = *uv;
    fVar20 = fVar21 - fVar20;
    fVar23 = fVar22 - fVar23;
    fVar17 = fVar20 * fVar20 + fVar23 * fVar23;
    if (0.0 < fVar17) {
      if (fVar17 < 0.0) {
        fVar17 = sqrtf(fVar17);
      }
      else {
        fVar17 = SQRT(fVar17);
      }
      fVar20 = fVar20 * (1.0 / fVar17);
      fVar23 = fVar23 * (1.0 / fVar17);
    }
    fVar19 = fVar19 * 0.5;
    fVar20 = fVar20 * fVar19;
    fVar19 = fVar19 * fVar23;
    pIVar12 = DrawList->_VtxWritePtr;
    (pIVar12->pos).x = (this->P1).x + fVar19;
    (pIVar12->pos).y = (this->P1).y - fVar20;
    pIVar12->uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->col = IVar7;
    pIVar12[1].pos.x = fVar19 + fVar21;
    pIVar12[1].pos.y = fVar22 - fVar20;
    pIVar12[1].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[1].col = IVar7;
    pIVar12[2].pos.x = fVar21 - fVar19;
    pIVar12[2].pos.y = fVar20 + fVar22;
    pIVar12[2].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[2].col = IVar7;
    pIVar12[3].pos.x = (this->P1).x - fVar19;
    pIVar12[3].pos.y = fVar20 + (this->P1).y;
    pIVar12[3].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[3].col = IVar7;
    DrawList->_VtxWritePtr = pIVar12 + 4;
    uVar8 = DrawList->_VtxCurrentIdx;
    pIVar13 = DrawList->_IdxWritePtr;
    IVar15 = (ImDrawIdx)uVar8;
    *pIVar13 = IVar15;
    pIVar13[1] = IVar15 + 1;
    pIVar13[2] = IVar15 + 2;
    pIVar13[3] = IVar15;
    pIVar13[4] = IVar15 + 2;
    pIVar13[5] = IVar15 + 3;
    DrawList->_IdxWritePtr = pIVar13 + 6;
    DrawList->_VtxCurrentIdx = uVar8 + 4;
  }
  IVar5.y = fVar22;
  IVar5.x = fVar21;
  this->P1 = IVar5;
  return bVar16;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }